

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall spvtools::opt::CodeMetrics::Analyze(CodeMetrics *this,Loop *loop)

{
  size_t sVar1;
  bool bVar2;
  IRContext *this_00;
  CFG *this_01;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_02;
  reference pvVar3;
  BasicBlock *this_03;
  mapped_type *pmVar4;
  uint32_t local_7c;
  anon_class_8_1_70286780 local_78;
  function<void_(const_spvtools::opt::Instruction_*)> local_70;
  size_t local_50;
  size_t bb_size;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_38;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  CFG *cfg;
  Loop *loop_local;
  CodeMetrics *this_local;
  
  this_00 = Loop::GetContext(loop);
  this_01 = IRContext::cfg(this_00);
  this->roi_size_ = 0;
  std::
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::clear(&this->block_sizes_);
  this_02 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)Loop::GetBlocks(loop);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_02);
  _Stack_38._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_02);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffc8);
    if (!bVar2) break;
    pvVar3 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bb._4_4_ = *pvVar3;
    this_03 = CFG::block(this_01,bb._4_4_);
    local_50 = 0;
    local_78.bb_size = &local_50;
    bb_size = (size_t)this_03;
    std::function<void(spvtools::opt::Instruction_const*)>::
    function<spvtools::opt::CodeMetrics::Analyze(spvtools::opt::Loop_const&)::__0,void>
              ((function<void(spvtools::opt::Instruction_const*)> *)&local_70,&local_78);
    BasicBlock::ForEachInst(this_03,&local_70,false);
    std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_70);
    sVar1 = local_50;
    local_7c = BasicBlock::id((BasicBlock *)bb_size);
    pmVar4 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[](&this->block_sizes_,&local_7c);
    *pmVar4 = sVar1;
    this->roi_size_ = local_50 + this->roi_size_;
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

void CodeMetrics::Analyze(const Loop& loop) {
  CFG& cfg = *loop.GetContext()->cfg();

  roi_size_ = 0;
  block_sizes_.clear();

  for (uint32_t id : loop.GetBlocks()) {
    const BasicBlock* bb = cfg.block(id);
    size_t bb_size = 0;
    bb->ForEachInst([&bb_size](const Instruction* insn) {
      if (insn->opcode() == spv::Op::OpLabel) return;
      if (insn->IsNop()) return;
      if (insn->opcode() == spv::Op::OpPhi) return;
      bb_size++;
    });
    block_sizes_[bb->id()] = bb_size;
    roi_size_ += bb_size;
  }
}